

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  byte bVar1;
  Output *command;
  char cVar2;
  _func_int ***ppp_Var3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *n;
  Output *pOVar7;
  Clunk engine;
  UCIAdapter adapter;
  char sbuf [16384];
  Clunk CStack_40b8;
  UCIAdapter local_4080;
  Output local_4028 [2049];
  
  clunk::Clunk::Clunk(&CStack_40b8);
  senjo::UCIAdapter::UCIAdapter(&local_4080);
  bVar4 = senjo::UCIAdapter::Start(&local_4080,&CStack_40b8.super_ChessEngine);
  if (bVar4) {
    memset(local_4028,0,0x4000);
LAB_0013ad28:
    pcVar6 = fgets((char *)local_4028,0x4000,_stdin);
    pOVar7 = local_4028;
    if (pcVar6 != (char *)0x0) {
      do {
        bVar1 = *(byte *)&pOVar7->_vptr_Output;
        if (bVar1 < 0x20) {
          command = local_4028;
          cVar2 = (char)local_4028[0]._vptr_Output;
          if (bVar1 == 0) goto joined_r0x0013ad84;
          if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_0013ad74;
LAB_0013ad5f:
          iVar5 = isspace((int)(char)bVar1);
          if (iVar5 != 0) {
            *(char *)&pOVar7->_vptr_Output = ' ';
          }
        }
        else if (bVar1 != 0x20) goto LAB_0013ad5f;
        pOVar7 = (Output *)((long)&pOVar7->_vptr_Output + 1);
      } while( true );
    }
    goto LAB_0013adb3;
  }
  senjo::Output::Output(local_4028,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Unable to start UCIAdapter",0x1a);
  senjo::Output::~Output(local_4028);
  iVar5 = 1;
LAB_0013adf3:
  senjo::UCIAdapter::~UCIAdapter(&local_4080);
  clunk::Clunk::~Clunk(&CStack_40b8);
  return iVar5;
LAB_0013ad74:
  *(char *)&pOVar7->_vptr_Output = '\0';
  cVar2 = (char)local_4028[0]._vptr_Output;
joined_r0x0013ad84:
  while ((cVar2 != '\0' && (iVar5 = isspace((int)cVar2), iVar5 != 0))) {
    ppp_Var3 = &command->_vptr_Output;
    command = (Output *)((long)&command->_vptr_Output + 1);
    cVar2 = *(char *)((long)ppp_Var3 + 1);
  }
  bVar4 = senjo::UCIAdapter::DoCommand(&local_4080,(char *)command);
  if (!bVar4) goto LAB_0013adb3;
  goto LAB_0013ad28;
LAB_0013adb3:
  iVar5 = 0;
  goto LAB_0013adf3;
}

Assistant:

int main(int /*argc*/, char** /*argv*/)
{
  Clunk engine;
  senjo::UCIAdapter adapter;

  if (!adapter.Start(engine)) {
    senjo::Output() << "Unable to start UCIAdapter";
    return 1;
  }

  char sbuf[16384];
  memset(sbuf, 0, sizeof(sbuf));

  while (fgets(sbuf, sizeof(sbuf), stdin)) {
    char* cmd = sbuf;
    senjo::NormalizeString(cmd);
    if (!adapter.DoCommand(cmd)) {
      break;
    }
  }

  return 0;
}